

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_cmdline_handle_short_opt_group_
              (ACUTEST_CMDLINE_OPTION_ *options,char *arggroup,_func_int_int_char_ptr *callback)

{
  int iVar1;
  char local_33;
  char local_32;
  undefined1 local_31;
  int local_30;
  int iStack_2c;
  char badoptname [3];
  int ret;
  int i;
  ACUTEST_CMDLINE_OPTION_ *opt;
  _func_int_int_char_ptr *callback_local;
  char *arggroup_local;
  ACUTEST_CMDLINE_OPTION_ *options_local;
  
  local_30 = 0;
  iStack_2c = 0;
  while( true ) {
    _ret = options;
    if (arggroup[iStack_2c] == '\0') {
      return local_30;
    }
    for (; (_ret->id != 0 && (arggroup[iStack_2c] != _ret->shortname)); _ret = _ret + 1) {
    }
    if ((_ret->id == 0) || ((_ret->flags & 2) != 0)) {
      local_33 = '-';
      local_32 = arggroup[iStack_2c];
      local_31 = 0;
      iVar1 = -0x7fffffff;
      if (_ret->id != 0) {
        iVar1 = -0x7ffffffe;
      }
      local_30 = (*callback)(iVar1,&local_33);
    }
    else {
      local_30 = (*callback)(_ret->id,(char *)0x0);
    }
    if (local_30 != 0) break;
    iStack_2c = iStack_2c + 1;
  }
  return local_30;
}

Assistant:

static int
acutest_cmdline_handle_short_opt_group_(const ACUTEST_CMDLINE_OPTION_* options,
                    const char* arggroup,
                    int (*callback)(int /*optval*/, const char* /*arg*/))
{
    const ACUTEST_CMDLINE_OPTION_* opt;
    int i;
    int ret = 0;

    for(i = 0; arggroup[i] != '\0'; i++) {
        for(opt = options; opt->id != 0; opt++) {
            if(arggroup[i] == opt->shortname)
                break;
        }

        if(opt->id != 0  &&  !(opt->flags & ACUTEST_CMDLINE_OPTFLAG_REQUIREDARG_)) {
            ret = callback(opt->id, NULL);
        } else {
            /* Unknown option. */
            char badoptname[3];
            badoptname[0] = '-';
            badoptname[1] = arggroup[i];
            badoptname[2] = '\0';
            ret = callback((opt->id != 0 ? ACUTEST_CMDLINE_OPTID_MISSINGARG_ : ACUTEST_CMDLINE_OPTID_UNKNOWN_),
                            badoptname);
        }

        if(ret != 0)
            break;
    }

    return ret;
}